

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_sched_perf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  _Setw _Var1;
  ostream *poVar2;
  ostream *poVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined4 in_EDI;
  double dVar6;
  double normalized_par_to_seq_ratio;
  size_t ntasks_1;
  size_t tile_sz;
  size_t ntasks;
  anon_class_1_0_00000001_for__M_f task;
  undefined1 in_stack_ffffffffffffff8f;
  anon_class_1_0_00000001_for__M_f *in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffffa7;
  char cVar8;
  size_type in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 uVar9;
  undefined1 in_stack_ffffffffffffffb3;
  char cVar10;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_40;
  int in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd0;
  size_t sVar11;
  ulong local_20;
  undefined4 uVar12;
  
  uVar12 = 0;
  process_arguments(CONCAT13(in_stack_ffffffffffffffa7,
                             CONCAT12(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa4)),
                    in_stack_ffffffffffffff98);
  depspawn::set_threads((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  if (-1 < Queue_limit) {
    depspawn::set_task_queue_limit(Queue_limit);
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,
                      CONCAT13(in_stack_ffffffffffffffb3,
                               CONCAT12(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0))),
             in_stack_ffffffffffffffa8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,
                      CONCAT13(in_stack_ffffffffffffffb3,
                               CONCAT12(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0))),
             in_stack_ffffffffffffffa8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,Nthreads);
  poVar2 = std::operator<<(poVar2," threads max_tile_size=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,MaxTileSize);
  poVar2 = std::operator<<(poVar2," NReps=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,NReps);
  poVar2 = std::operator<<(poVar2," ClearCache=");
  uVar9 = 0x4e;
  cVar10 = 'Y';
  if ((ClearCaches & 1U) == 0) {
    cVar10 = 'N';
  }
  poVar3 = std::operator<<(poVar2,cVar10);
  poVar3 = std::operator<<(poVar3," QueueLimit=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,Queue_limit);
  poVar3 = std::operator<<(poVar3," EnqueueTasks=");
  uVar7 = 0x4e;
  cVar8 = 'Y';
  if ((depspawn::internal::EnqueueTasks & 1) == 0) {
    cVar8 = 'N';
  }
  poVar4 = std::operator<<(poVar3,cVar8);
  poVar4 = std::operator<<(poVar4," Baseline=");
  pcVar5 = "Sequential";
  if ((ParallelBaseline & 1U) != 0) {
    pcVar5 = "Parallel";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"non-");
  std::operator<<(poVar4,"TBB parallel baseline version\n");
  if ((OnlyParallelRun & 1U) == 0) {
    depspawn::get_task_pool();
    depspawn::internal::TaskPool::parallel_for<unsigned_long,main::__0>
              ((TaskPool *)
               CONCAT44(in_stack_ffffffffffffffb4,
                        CONCAT13(cVar10,CONCAT12(uVar9,in_stack_ffffffffffffffb0))),
               (unsigned_long)poVar2,
               CONCAT17(cVar8,CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffffa4,
                                                      in_stack_ffffffffffffffa0))),
               (unsigned_long)poVar3,in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
    bench_parallel_time(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  std::operator<<((ostream *)&std::cout,"size %");
  for (local_20 = 0x80; local_20 <= MaxNTasks; local_20 = local_20 << 1) {
    _Var1 = std::setw(5);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    std::operator<<(poVar2,"    ");
  }
  std::operator<<((ostream *)&std::cout,"tasks\n");
  for (sVar11 = 10; sVar11 <= MaxTileSize; sVar11 = sVar11 + 5) {
    if (Verbosity != 0) {
      std::operator<<((ostream *)&std::cout,"Tests for TSZ=");
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::right);
    _Var1 = std::setw(3);
    poVar2 = std::operator<<(poVar2,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar11);
    poVar2 = std::operator<<(poVar2,' ');
    std::ostream::operator<<(poVar2,std::left);
    if (Verbosity != 0) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    cur_tile_sz = sVar11;
    sVar11 = cur_tile_sz;
    for (local_40 = 0x80; local_40 <= MaxNTasks; local_40 = local_40 << 1) {
      dVar6 = bench_sched_perf(CONCAT44(uVar12,in_EDI));
      if (Verbosity != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"TSZ=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar11);
        poVar2 = std::operator<<(poVar2," NTASKS=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
        std::operator<<(poVar2," r=");
      }
      _Var1 = std::setw(8);
      poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
      std::operator<<(poVar2,' ');
      if (Verbosity != 0) {
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  process_arguments(argc, argv);
  
  //test_TP("before set_threads");
  set_threads(Nthreads);
  //test_TP("after set_threads");
  
  if (Queue_limit >= 0) {
    set_task_queue_limit(Queue_limit);
  }
  
  TSeq.resize(NReps);
  TPar.resize(NReps);

  std::cout << Nthreads << " threads max_tile_size=" << MaxTileSize << " NReps=" << NReps << " ClearCache=" << (ClearCaches ? 'Y' : 'N') << " QueueLimit=" << Queue_limit << " EnqueueTasks=" << (depspawn::internal::EnqueueTasks ? 'Y' : 'N') << " Baseline=" << (ParallelBaseline ? "Parallel" : "Sequential") << std::endl;

  std::cout <<
#ifndef USE_TBB
  "non-" <<
#endif
  "TBB parallel baseline version\n";

  if(!OnlyParallelRun) {
    const auto task = [] (size_t i) { Destination[i].clear(); };

#ifdef USE_TBB
    // This is to try to build the threads before the first test; just in case
    tbb::parallel_for(size_t(0), MAX_NTASKS, task);
#else
    get_task_pool().parallel_for((size_t)0, MAX_NTASKS, (size_t)1, task, false);
//    TP->launch_threads();
//    for (size_t i = 0; i < MAX_NTASKS; i++) {
//      TP->enqueue(task, i);
//    }
//    TP->wait(false);
#endif

    //1-time runtime preheat (for memory pools)
    bench_parallel_time(MaxNTasks, 1);
  }
  
  std::cout << "size %";
  for (size_t ntasks = (1 << 7); ntasks <= MaxNTasks; ntasks *= 2) {
    std::cout << std::setw(5) << ntasks << "    ";
  }
  std::cout << "tasks\n";
  
  for (size_t tile_sz=10; tile_sz <= MaxTileSize; tile_sz += 5) {
    if (Verbosity) {
      std::cout << "Tests for TSZ=";
    }
    std::cout << std::right << std::setw(3) << tile_sz << ' ' << std::left;
    if (Verbosity) {
      std::cout << std::endl;
    }
    cur_tile_sz = tile_sz;
    for (size_t ntasks = (1 << 7); ntasks <= MaxNTasks; ntasks *= 2) {
      const double normalized_par_to_seq_ratio = bench_sched_perf(ntasks);
      if (Verbosity) {
        std::cout << "TSZ=" << tile_sz << " NTASKS=" << ntasks << " r=";
      }
      std::cout << std::setw(8) << normalized_par_to_seq_ratio << ' ';
      if (Verbosity) {
        std::cout << std::endl;
      }
    }
    //std::cout << '%' << tile_sz;
    std::cout << std::endl;
  }
  
  //test_TP("before exiting");
  
  return 0;
}